

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QRectF>::reallocateAndGrow
          (QArrayDataPointer<QRectF> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QRectF> *old)

{
  QArrayData *pQVar1;
  qsizetype qVar2;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  long lVar6;
  QRectF *pQVar7;
  QRectF *pQVar8;
  QRectF *pQVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  QArrayDataPointer<QRectF> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QRectF> *)0x0 && where == GrowsAtEnd) &&
       (pQVar1 = &this->d->super_QArrayData, pQVar1 != (QArrayData *)0x0)) && (0 < n)) &&
     ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar10 = QArrayData::reallocateUnaligned
                        (pQVar1,this->ptr,0x20,
                         n + this->size +
                         ((long)((long)this->ptr -
                                ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 5),
                         Grow);
    this->d = (Data *)auVar10._0_8_;
    this->ptr = (QRectF *)auVar10._8_8_;
  }
  else {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (QRectF *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_38,this,n,where);
    if (this->size != 0) {
      lVar6 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QRectF> *)0x0)) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        if (0 < lVar6) {
          pQVar8 = this->ptr;
          pQVar7 = pQVar8 + lVar6;
          pQVar9 = local_38.ptr + local_38.size;
          do {
            qVar3 = pQVar8->xp;
            qVar4 = pQVar8->yp;
            qVar5 = pQVar8->h;
            pQVar9->w = pQVar8->w;
            pQVar9->h = qVar5;
            pQVar9->xp = qVar3;
            pQVar9->yp = qVar4;
            pQVar8 = pQVar8 + 1;
            local_38.size = local_38.size + 1;
            pQVar9 = pQVar9 + 1;
          } while (pQVar8 < pQVar7);
        }
      }
      else if (0 < lVar6) {
        pQVar8 = this->ptr;
        pQVar7 = pQVar8 + lVar6;
        pQVar9 = local_38.ptr + local_38.size;
        do {
          qVar3 = pQVar8->xp;
          qVar4 = pQVar8->yp;
          qVar5 = pQVar8->h;
          pQVar9->w = pQVar8->w;
          pQVar9->h = qVar5;
          pQVar9->xp = qVar3;
          pQVar9->yp = qVar4;
          pQVar8 = pQVar8 + 1;
          local_38.size = local_38.size + 1;
          pQVar9 = pQVar9 + 1;
        } while (pQVar8 < pQVar7);
      }
    }
    pQVar1 = &this->d->super_QArrayData;
    this->d = local_38.d;
    pQVar8 = this->ptr;
    this->ptr = local_38.ptr;
    qVar2 = this->size;
    this->size = local_38.size;
    local_38.d = (Data *)pQVar1;
    local_38.ptr = pQVar8;
    local_38.size = qVar2;
    if (old != (QArrayDataPointer<QRectF> *)0x0) {
      local_38.d = old->d;
      old->d = (Data *)pQVar1;
      local_38.ptr = old->ptr;
      old->ptr = pQVar8;
      local_38.size = old->size;
      old->size = qVar2;
    }
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x20,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }